

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler-ls.h
# Opt level: O2

string * __thiscall
wabt::LoadStoreTracking::AddrExpName_abi_cxx11_
          (string *__return_storage_ptr__,LoadStoreTracking *this,Node *addr_exp)

{
  VarExpr<(wabt::ExprType)24> *pVVar1;
  string *psVar2;
  allocator<char> local_9;
  
  if (addr_exp->etype == LocalTee) {
    pVVar1 = (VarExpr<(wabt::ExprType)24> *)
             cast<wabt::VarExpr<(wabt::ExprType)26>,wabt::Expr>(addr_exp->e);
  }
  else {
    if (addr_exp->etype != LocalGet) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"",&local_9);
      return __return_storage_ptr__;
    }
    pVVar1 = cast<wabt::VarExpr<(wabt::ExprType)24>,wabt::Expr>(addr_exp->e);
  }
  psVar2 = Var::name_abi_cxx11_(&pVVar1->var);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar2);
  return __return_storage_ptr__;
}

Assistant:

const std::string AddrExpName(const Node& addr_exp) const {
    // TODO: expand this to more kinds of address expressions.
    switch (addr_exp.etype) {
      case ExprType::LocalGet:
        return cast<LocalGetExpr>(addr_exp.e)->var.name();
        break;
      case ExprType::LocalTee:
        return cast<LocalTeeExpr>(addr_exp.e)->var.name();
        break;
      default:
        return "";
    }
  }